

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O1

uint32_t helper_neon_unarrow_sat16_aarch64(CPUARMState_conflict *env,uint64_t x)

{
  uint uVar1;
  int iVar2;
  uint32_t low;
  uint uVar3;
  
  uVar3 = (uint)x;
  if ((int)uVar3 < 0) {
    uVar1 = 0;
LAB_0062dbe2:
    (env->vfp).qc[0] = 1;
    uVar3 = uVar1;
  }
  else {
    uVar1 = 0xffff;
    if (0xffff < uVar3) goto LAB_0062dbe2;
  }
  if ((long)x < 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0xffff;
    if (x >> 0x30 == 0) {
      iVar2 = (int)(x >> 0x20);
      goto LAB_0062dc15;
    }
  }
  (env->vfp).qc[0] = 1;
LAB_0062dc15:
  return iVar2 << 0x10 | uVar3;
}

Assistant:

uint32_t HELPER(neon_unarrow_sat16)(CPUARMState *env, uint64_t x)
{
    uint32_t high;
    uint32_t low;
    low = x;
    if (low & 0x80000000) {
        low = 0;
        SET_QC();
    } else if (low > 0xffff) {
        low = 0xffff;
        SET_QC();
    }
    high = x >> 32;
    if (high & 0x80000000) {
        high = 0;
        SET_QC();
    } else if (high > 0xffff) {
        high = 0xffff;
        SET_QC();
    }
    return low | (high << 16);
}